

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.cpp
# Opt level: O0

string * bhf::StringTo<std::__cxx11::string>(string *v,string *param_2)

{
  string *param_1_local;
  string *v_local;
  
  std::__cxx11::string::string((string *)v,(string *)param_2);
  return v;
}

Assistant:

std::string StringTo<std::string>(const std::string& v, const std::string)
{
    return v;
}